

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# worn.c
# Opt level: O2

int racial_exception(monst *mon,obj *obj)

{
  permonst *ppVar1;
  uint uVar2;
  
  ppVar1 = raceptr(mon);
  if (ppVar1 == mons + 0x2c) {
    uVar2 = (ushort)obj->otyp - 0x70;
    if ((uVar2 < 0x2a) && ((0x20002002001U >> ((ulong)uVar2 & 0x3f) & 1) != 0)) {
      return 1;
    }
    if (obj->otyp == 0x48) {
      return 1;
    }
  }
  return 0;
}

Assistant:

int racial_exception(struct monst *mon, struct obj *obj)
{
    const struct permonst *ptr = raceptr(mon);

    /* Acceptable Exceptions: */
    /* Allow hobbits to wear elven armor - LoTR */
    if (ptr == &mons[PM_HOBBIT] && is_elven_armor(obj))
	return 1;
    /* Unacceptable Exceptions: */
    /* Checks for object that certain races should never use go here */
    /*	return -1; */

    return 0;
}